

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# APFloat.cpp
# Opt level: O0

bool __thiscall llvm::detail::DoubleAPFloat::isInteger(DoubleAPFloat *this)

{
  bool bVar1;
  type pAVar2;
  bool local_21;
  DoubleAPFloat *this_local;
  
  if (this->Semantics == (fltSemantics *)semPPCDoubleDouble) {
    pAVar2 = std::unique_ptr<llvm::APFloat[],_std::default_delete<llvm::APFloat[]>_>::operator[]
                       (&this->Floats,0);
    bVar1 = APFloat::isInteger(pAVar2);
    local_21 = false;
    if (bVar1) {
      pAVar2 = std::unique_ptr<llvm::APFloat[],_std::default_delete<llvm::APFloat[]>_>::operator[]
                         (&this->Floats,1);
      local_21 = APFloat::isInteger(pAVar2);
    }
    return local_21;
  }
  __assert_fail("Semantics == &semPPCDoubleDouble && \"Unexpected Semantics\"",
                "/workspace/llm4binary/github/license_c_cmakelists/apple[P]swift-llbuild/lib/llvm/Support/APFloat.cpp"
                ,0x1115,"bool llvm::detail::DoubleAPFloat::isInteger() const");
}

Assistant:

bool DoubleAPFloat::isInteger() const {
  assert(Semantics == &semPPCDoubleDouble && "Unexpected Semantics");
  return Floats[0].isInteger() && Floats[1].isInteger();
}